

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

QDateTimeEditPrivate * __thiscall
QDateTimeEditPrivate::stepBy(QDateTimeEditPrivate *this,int sectionIndex,int steps,bool test)

{
  QDateTime *pQVar1;
  uint uVar2;
  long *plVar3;
  bool bVar4;
  int *piVar5;
  QLocale QVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint *puVar12;
  long lVar13;
  int iVar14;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  long *plVar15;
  QDateTime *pQVar16;
  int in_R8D;
  long in_FS_OFFSET;
  bool bVar17;
  QDateTime maximumDateTime;
  QDateTime minimumDateTime;
  int pos;
  QDateTime v;
  QDateTime t;
  char local_bc;
  QDateTime local_b8 [8];
  undefined1 *local_b0;
  undefined1 *local_a8;
  int local_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 *local_88;
  QLocale local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  plVar15 = (long *)CONCAT44(in_register_00000034,sectionIndex);
  iVar14 = (int)CONCAT71(in_register_00000009,test);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar3 = (long *)plVar15[1];
  local_80 = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_8c = 0xaaaaaaaa;
  (**(code **)(*plVar15 + 0x110))(&local_98,plVar15);
  local_9c = QLineEdit::cursorPosition((QLineEdit *)plVar15[0x6f]);
  pQVar1 = (QDateTime *)(plVar15 + 0x7b);
  iVar10 = (int)pQVar1;
  puVar12 = (uint *)QDateTimeParser::sectionNode(iVar10);
  uVar2 = *puVar12;
  if (((in_R8D == 0) && ((*(byte *)(plVar15 + 0x7a) & 1) != 0)) &&
     (iVar8 = (**(code **)(*plVar3 + 0x1a0))(plVar3,&local_98,&local_9c), iVar8 == 2)) {
    (**(code **)(*plVar3 + 0x1d0))(&local_58,plVar3,&local_98);
    QVar6 = local_80;
    local_80 = (QLocale)local_58.shared;
    local_58.shared = (PrivateShared *)QVar6;
    QDateTime::~QDateTime((QDateTime *)local_58.data);
  }
  iVar8 = QDateTimeParser::getDigit(pQVar1,(int)&local_80);
  iVar9 = QDateTimeParser::absoluteMin(iVar10);
  ::QVariant::toDateTime();
  iVar10 = QDateTimeParser::absoluteMax(iVar10,(QDateTime *)(ulong)(uint)steps);
  QDateTime::~QDateTime((QDateTime *)local_58.data);
  if ((uVar2 & 0x3000) == 0) {
    iVar8 = iVar8 + iVar14;
    iVar11 = (iVar10 - iVar9) + 1;
    if (iVar8 < iVar9) {
      iVar8 = iVar11 + iVar8;
      if ((*(byte *)(plVar15 + 0x7a) & 4) == 0) {
        iVar8 = iVar9;
      }
    }
    else if ((iVar10 < iVar8) && (iVar8 = iVar8 - iVar11, (*(byte *)(plVar15 + 0x7a) & 4) == 0)) {
      iVar8 = iVar10;
    }
  }
  else {
    if ((*(byte *)(plVar15 + 0x7a) & 4) == 0) {
      (**(code **)(*plVar15 + 0x128))(&local_58,plVar15);
      iVar10 = QLocale::firstDayOfWeek();
      QLocale::~QLocale((QLocale *)&local_58.shared);
      iVar9 = iVar10 + -7;
      if (iVar10 <= iVar8) {
        iVar9 = iVar10;
      }
      iVar10 = (-(uint)(iVar8 < iVar10) | 6) + iVar10;
      if (iVar8 + iVar14 <= iVar10) {
        iVar10 = iVar8 + iVar14;
      }
      if (iVar10 < iVar9) {
        iVar10 = iVar9;
      }
    }
    else {
      iVar10 = iVar8 + iVar14;
    }
    iVar8 = iVar10 + 7 + (iVar10 / 7) * -7;
    if (0 < iVar10 % 7) {
      iVar8 = iVar10 % 7;
    }
  }
  local_58.shared = (PrivateShared *)QDateTime::date();
  iVar10 = QDate::day(&local_58,plVar15[0x8d]);
  cVar7 = QDateTimeParser::setDigit(pQVar1,(int)&local_80,steps);
  if (((cVar7 != '\0') && (iVar9 = QDateTimeParser::getDigit(pQVar1,(int)&local_80), iVar14 < 0)) &&
     ((iVar9 != iVar8 && ((uVar2 & 0x30) != 0)))) {
    lVar13 = QDateTime::toMSecsSinceEpoch();
    QDateTime::timeRepresentation();
    QDateTime::fromMSecsSinceEpoch((longlong)&local_58,(QTimeZone *)(lVar13 + -3600000));
    QVar6 = local_80;
    local_80 = (QLocale)local_58.shared;
    local_58.shared = (PrivateShared *)QVar6;
    QDateTime::~QDateTime((QDateTime *)local_58.data);
    QTimeZone::~QTimeZone((QTimeZone *)&local_78.shared);
  }
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  if ((uVar2 != 1 && (uVar2 & 0x3000) == 0) &&
     ((cVar7 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_a8), cVar7 < '\0' ||
      (cVar7 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_b0), '\0' < cVar7)))) {
    QDateTimeParser::getDigit(pQVar1,(int)&local_a8);
    QDateTimeParser::getDigit(pQVar1,(int)&local_b0);
    if ((*(byte *)(plVar15 + 0x7a) & 4) == 0) {
LAB_003ee012:
      QDateTimeParser::setDigit(pQVar1,(int)&local_80,steps);
    }
    else if (iVar14 < 1) {
      QDateTimeParser::setDigit(pQVar1,(int)&local_80,steps);
      if (((uVar2 >> 8 & 1) == 0) && ((*(byte *)((long)plVar15 + 0x471) & 0x3f) != 0)) {
        local_58.shared = (PrivateShared *)QDateTime::date();
        iVar8 = QDate::daysInMonth(&local_58,plVar15[0x8d]);
        local_58.shared = (PrivateShared *)QDateTime::date();
        iVar9 = QDate::day(&local_58,plVar15[0x8d]);
        if (iVar9 < iVar10) {
          local_78.shared = (PrivateShared *)QDateTime::date();
          iVar9 = QDate::day(&local_78,plVar15[0x8d]);
          if (iVar9 < iVar8) {
            local_78.shared = (PrivateShared *)QDateTime::date();
            QDate::day(&local_78,plVar15[0x8d]);
            QDateTime::addDays((longlong)&local_58);
            QVar6 = local_80;
            local_80 = (QLocale)local_58.shared;
            local_58.shared = (PrivateShared *)QVar6;
            QDateTime::~QDateTime((QDateTime *)local_58.data);
          }
        }
      }
      cVar7 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_b0);
      if ('\0' < cVar7) {
        QDateTimeParser::setDigit(pQVar1,(int)(QDateTime *)&local_80,steps);
        cVar7 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_b0);
        if ('\0' < cVar7) goto LAB_003ee012;
      }
    }
    else {
      QDateTimeParser::setDigit(pQVar1,(int)&local_80,steps);
      if (((uVar2 >> 8 & 1) == 0) && ((*(byte *)((long)plVar15 + 0x471) & 0x3f) != 0)) {
        local_58.shared = (PrivateShared *)QDateTime::date();
        iVar8 = QDate::daysInMonth(&local_58,plVar15[0x8d]);
        local_58.shared = (PrivateShared *)QDateTime::date();
        iVar9 = QDate::day(&local_58,plVar15[0x8d]);
        if (iVar9 < iVar10) {
          local_78.shared = (PrivateShared *)QDateTime::date();
          iVar9 = QDate::day(&local_78,plVar15[0x8d]);
          if (iVar9 < iVar8) {
            local_78.shared = (PrivateShared *)QDateTime::date();
            QDate::day(&local_78,plVar15[0x8d]);
            QDateTime::addDays((longlong)&local_58);
            QVar6 = local_80;
            local_80 = (QLocale)local_58.shared;
            local_58.shared = (PrivateShared *)QVar6;
            QDateTime::~QDateTime((QDateTime *)local_58.data);
          }
        }
      }
      cVar7 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_a8);
      if (cVar7 < '\0') {
        QDateTimeParser::setDigit(pQVar1,(int)(QDateTime *)&local_80,steps);
        cVar7 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_a8);
        if (cVar7 < '\0') goto LAB_003ee012;
      }
    }
  }
  local_bc = (char)in_R8D;
  if (local_bc == '\0') {
    local_58.shared = (PrivateShared *)QDateTime::date();
    iVar8 = QDate::day(&local_58,plVar15[0x8d]);
    if ((iVar10 != iVar8) && ((uVar2 & 0x3100) == 0)) {
      iVar8 = *(int *)((long)plVar15 + 0x3ec);
      if (*(int *)((long)plVar15 + 0x3ec) < iVar10) {
        iVar8 = iVar10;
      }
      *(int *)((long)plVar15 + 0x3ec) = iVar8;
    }
  }
  cVar7 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_a8);
  if (cVar7 < '\0') {
    if ((*(byte *)(plVar15 + 0x7a) & 4) == 0) {
LAB_003ee438:
      ::QVariant::toDateTime();
      QVar6 = local_80;
      local_80 = (QLocale)local_58.shared;
      local_58.shared = (PrivateShared *)QVar6;
      QDateTime::~QDateTime((QDateTime *)local_58.data);
      goto LAB_003ee559;
    }
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QDateTime::QDateTime((QDateTime *)local_58.data,(QDateTime *)&local_80);
    QDateTimeParser::setDigit(pQVar1,(int)&local_58,steps);
    cVar7 = compareThreeWay((QDateTime *)local_58.data,(QDateTime *)&local_a8);
    bVar17 = -1 < cVar7;
    cVar7 = compareThreeWay((QDateTime *)local_58.data,(QDateTime *)&local_b0);
    bVar4 = cVar7 < '\x01';
    if (!bVar17 || !bVar4) {
      pQVar16 = (QDateTime *)&local_a8;
      if (iVar14 < 0) {
        pQVar16 = (QDateTime *)&local_b0;
      }
LAB_003ee4e6:
      QDateTimeParser::getDigit(pQVar1,(int)pQVar16);
      QDateTimeParser::setDigit(pQVar1,(int)&local_58,steps);
      cVar7 = compareThreeWay((QDateTime *)local_58.data,(QDateTime *)&local_a8);
      bVar17 = -1 < cVar7;
      cVar7 = compareThreeWay((QDateTime *)local_58.data,(QDateTime *)&local_b0);
      bVar4 = cVar7 < '\x01';
    }
  }
  else {
    cVar7 = compareThreeWay((QDateTime *)&local_80,(QDateTime *)&local_b0);
    if (cVar7 < '\x01') goto LAB_003ee559;
    if ((*(byte *)(plVar15 + 0x7a) & 4) == 0) goto LAB_003ee438;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QDateTime::QDateTime((QDateTime *)local_58.data,(QDateTime *)&local_80);
    QDateTimeParser::setDigit(pQVar1,(int)&local_58,steps);
    cVar7 = compareThreeWay((QDateTime *)local_58.data,(QDateTime *)&local_a8);
    bVar17 = -1 < cVar7;
    cVar7 = compareThreeWay((QDateTime *)local_58.data,(QDateTime *)&local_b0);
    bVar4 = cVar7 < '\x01';
    if (!bVar17 || !bVar4) {
      pQVar16 = (QDateTime *)&local_b0;
      if (0 < iVar14) {
        pQVar16 = (QDateTime *)&local_a8;
      }
      goto LAB_003ee4e6;
    }
  }
  if ((bVar17) && (bVar4)) {
    QDateTime::operator=((QDateTime *)&local_80,(QDateTime *)local_58.data);
  }
  QDateTime::~QDateTime((QDateTime *)local_58.data);
LAB_003ee559:
  ::QVariant::QVariant((QVariant *)&local_78,(QDateTime *)&local_80);
  (**(code **)(*plVar15 + 0xb8))(&local_58,plVar15,&local_78,plVar15 + 0x54,iVar14);
  ::QVariant::toDateTime();
  QDateTime::toTimeZone((QTimeZone *)this);
  QDateTime::~QDateTime(local_b8);
  ::QVariant::~QVariant((QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_78);
  QDateTime::~QDateTime((QDateTime *)&local_b0);
  QDateTime::~QDateTime((QDateTime *)&local_a8);
  piVar5 = (int *)CONCAT44(uStack_94,local_98);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,0x10);
    }
  }
  QDateTime::~QDateTime((QDateTime *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QDateTime QDateTimeEditPrivate::stepBy(int sectionIndex, int steps, bool test) const
{
    Q_Q(const QDateTimeEdit);
    QDateTime v = value.toDateTime();
    QString str = displayText();
    int pos = edit->cursorPosition();
    const SectionNode sn = sectionNode(sectionIndex);

    // to make sure it behaves reasonably when typing something and then stepping in non-tracking mode
    if (!test && pendingEmit && q->validate(str, pos) == QValidator::Acceptable)
        v = q->dateTimeFromText(str);
    int val = getDigit(v, sectionIndex);

    const int min = absoluteMin(sectionIndex);
    const int max = absoluteMax(sectionIndex, value.toDateTime());

    if (sn.type & DayOfWeekSectionMask) {
        // Must take locale's first day of week into account when *not*
        // wrapping; min and max don't help us.
#ifndef QT_ALWAYS_WRAP_WEEKDAY // (documentation, not an actual define)
        if (!wrapping) {
            /* It's not clear this is ever really a desirable behavior.

               It refuses to step backwards from the first day of the week or
               forwards from the day before, only allowing day-of-week stepping
               from start to end of one week. That's strictly what non-wrapping
               behavior must surely mean, when put in locale-neutral terms.

               It is, however, likely that users would prefer the "more natural"
               behavior of cycling through the week.
            */
            const int first = int(locale().firstDayOfWeek()); // Mon = 1 through 7 = Sun
            val = qBound(val < first ? first - 7 : first,
                         val + steps,
                         val < first ? first - 1 : first + 6);
        } else
#endif
        {
            val += steps;
        }

        // Restore to range from 1 through 7:
        val = val % 7;
        if (val <= 0)
            val += 7;
    } else {
        val += steps;
        const int span = max - min + 1;
        if (val < min)
            val = wrapping ? val + span : min;
        else if (val > max)
            val = wrapping ? val - span : max;
    }

    const int oldDay = v.date().day(calendar);

    /*
        Stepping into a daylight saving time that doesn't exist (setDigit() is
        true when date and time are valid, even if the date-time returned
        isn't), so use the time that has the same distance from epoch.
    */
    if (setDigit(v, sectionIndex, val) && getDigit(v, sectionIndex) != val
        && sn.type & HourSectionMask && steps < 0) {
        // decreasing from e.g 3am to 2am would get us back to 3am, but we want 1am
        auto msecsSinceEpoch = v.toMSecsSinceEpoch() - 3600 * 1000;
        v = QDateTime::fromMSecsSinceEpoch(msecsSinceEpoch, v.timeRepresentation());
    }
    // if this sets year or month it will make
    // sure that days are lowered if needed.

    const QDateTime minimumDateTime = minimum.toDateTime();
    const QDateTime maximumDateTime = maximum.toDateTime();
    // changing one section should only modify that section, if possible
    if (sn.type != AmPmSection && !(sn.type & DayOfWeekSectionMask)
        && (v < minimumDateTime || v > maximumDateTime)) {
        const int localmin = getDigit(minimumDateTime, sectionIndex);
        const int localmax = getDigit(maximumDateTime, sectionIndex);

        if (wrapping) {
            // just because we hit the roof in one direction, it
            // doesn't mean that we hit the floor in the other
            if (steps > 0) {
                setDigit(v, sectionIndex, min);
                if (!(sn.type & DaySectionMask) && sections & DateSectionMask) {
                    const int daysInMonth = v.date().daysInMonth(calendar);
                    if (v.date().day(calendar) < oldDay && v.date().day(calendar) < daysInMonth) {
                        const int adds = qMin(oldDay, daysInMonth);
                        v = v.addDays(adds - v.date().day(calendar));
                    }
                }

                if (v < minimumDateTime) {
                    setDigit(v, sectionIndex, localmin);
                    if (v < minimumDateTime)
                        setDigit(v, sectionIndex, localmin + 1);
                }
            } else {
                setDigit(v, sectionIndex, max);
                if (!(sn.type & DaySectionMask) && sections & DateSectionMask) {
                    const int daysInMonth = v.date().daysInMonth(calendar);
                    if (v.date().day(calendar) < oldDay && v.date().day(calendar) < daysInMonth) {
                        const int adds = qMin(oldDay, daysInMonth);
                        v = v.addDays(adds - v.date().day(calendar));
                    }
                }

                if (v > maximumDateTime) {
                    setDigit(v, sectionIndex, localmax);
                    if (v > maximumDateTime)
                        setDigit(v, sectionIndex, localmax - 1);
                }
            }
        } else {
            setDigit(v, sectionIndex, (steps > 0 ? localmax : localmin));
        }
    }
    if (!test && oldDay != v.date().day(calendar) && !(sn.type & DaySectionMask)) {
        // this should not happen when called from stepEnabled
        cachedDay = qMax<int>(oldDay, cachedDay);
    }

    if (v < minimumDateTime) {
        if (wrapping) {
            QDateTime t = v;
            setDigit(t, sectionIndex, steps < 0 ? max : min);
            bool mincmp = (t >= minimumDateTime);
            bool maxcmp = (t <= maximumDateTime);
            if (!mincmp || !maxcmp) {
                setDigit(t, sectionIndex, getDigit(steps < 0
                                                   ? maximumDateTime
                                                   : minimumDateTime, sectionIndex));
                mincmp = (t >= minimumDateTime);
                maxcmp = (t <= maximumDateTime);
            }
            if (mincmp && maxcmp) {
                v = t;
            }
        } else {
            v = value.toDateTime();
        }
    } else if (v > maximumDateTime) {
        if (wrapping) {
            QDateTime t = v;
            setDigit(t, sectionIndex, steps > 0 ? min : max);
            bool mincmp = (t >= minimumDateTime);
            bool maxcmp = (t <= maximumDateTime);
            if (!mincmp || !maxcmp) {
                setDigit(t, sectionIndex, getDigit(steps > 0 ?
                                                   minimumDateTime :
                                                   maximumDateTime, sectionIndex));
                mincmp = (t >= minimumDateTime);
                maxcmp = (t <= maximumDateTime);
            }
            if (mincmp && maxcmp) {
                v = t;
            }
        } else {
            v = value.toDateTime();
        }
    }

    return bound(v, value, steps).toDateTime().toTimeZone(timeZone);
}